

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O3

void __thiscall
StunMsgCxx_RFC5769SampleIPv4Response_Test::TestBody(StunMsgCxx_RFC5769SampleIPv4Response_Test *this)

{
  long *plVar1;
  long *plVar2;
  pointer msg_hdr;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  stun_attr_hdr *psVar8;
  stun_attr_xor_sockaddr *attr;
  stun_attr_msgint *msgint;
  stun_attr_uint32 *fingerprint;
  uint uVar9;
  pointer pcVar10;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar;
  sockaddr_in test_addr;
  message message;
  char software_name [12];
  char password [23];
  sockaddr_in ipv4;
  uint8_t tsx_id [12];
  AssertHelper local_e0;
  msgint local_d8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_a0;
  AssertHelper local_98;
  base_message<std::allocator<unsigned_char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined7 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_78._M_dataplus._M_p = (pointer)0x6365762074736574;
  local_78._M_string_length._0_4_ = 0x726f74;
  local_78.field_2._M_local_buf[0] = 'V';
  local_78.field_2._M_local_buf[1] = 'O';
  local_78.field_2._M_local_buf[2] = 'k';
  local_78.field_2._M_local_buf[3] = 'J';
  local_78.field_2._M_local_buf[4] = 'x';
  local_78.field_2._M_local_buf[5] = 'b';
  local_78.field_2._M_local_buf[6] = 'R';
  local_78.field_2._M_local_buf[7] = 'l';
  local_78.field_2._8_7_ = 0x6b5578546d5231;
  local_78.field_2._M_local_buf[0xf] = '/';
  uStack_58 = 0x7442784a7657;
  local_48.field_2._M_allocated_capacity = 0x86d634bc01a7e7b7;
  local_48.field_2._8_4_ = 0xaedf87fa;
  local_48._M_dataplus._M_p._0_4_ = 0x55800002;
  inet_pton(2,"192.0.2.1",(void *)((long)&local_48._M_dataplus._M_p + 4));
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            (&local_90,0x101,(uint8_t *)&local_48.field_2._M_allocated_capacity);
  sVar7 = strlen((char *)&local_78);
  local_c8._16_8_ = (long)&local_78._M_dataplus._M_p + sVar7;
  local_c8._0_2_ = 0x8022;
  local_c8[0x18] = ' ';
  local_c8._8_8_ = &local_78;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_90,(varsize<char> *)local_c8);
  local_a8._0_2_ = 0x20;
  sStack_a0.ptr_ = &local_48;
  stun::base_message<std::allocator<unsigned_char>_>::
  push_back<stun::attribute::bits::xor_socket_address>(&local_90,(xor_socket_address *)local_a8);
  local_d8.key_len_ = strlen(local_78.field_2._M_local_buf);
  local_d8.key_ = (uint8_t *)&local_78.field_2;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&local_90,&local_d8);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::fingerprint>
            (&local_90,(fingerprint *)&local_e0);
  local_a8 = (undefined1  [8])&DAT_00000050;
  local_d8.key_ =
       (uint8_t *)
       stun_msg_len((stun_msg_hdr *)
                    local_90.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"sizeof(expected_result)","message.size()",
             (unsigned_long *)local_a8,(unsigned_long *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xeb,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (((local_a8 != (undefined1  [8])0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_a8 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_0012936b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  anon_unknown.dwarf_24028::IsEqual
            ((anon_unknown_dwarf_24028 *)local_a8,&DAT_0014a3a0,
             local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x50);
  if (local_a8[0] == (anon_unknown_dwarf_24028)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_a8,
               (AssertionResult *)
               "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xed,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if ((((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_4_ = 0x101;
  uVar4 = stun_msg_type((stun_msg_hdr *)
                        local_90.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  local_d8.key_ = (uint8_t *)CONCAT62(local_d8.key_._2_6_,uVar4);
  testing::internal::
  CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
            ((internal *)local_c8,"stun::message::binding_response","message.type()",
             (type *)local_a8,(unsigned_short *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xf1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (((local_a8 != (undefined1  [8])0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_a8 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msg_hdr = local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar8 = stun_msg_next_attr((stun_msg_hdr *)
                              local_90.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
  local_a8[0] = (anon_unknown_dwarf_24028)(psVar8 != (stun_attr_hdr *)0x0);
  sStack_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (psVar8 == (stun_attr_hdr *)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_a8,(AssertionResult *)"message.end() != i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xf4,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if ((((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012936b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_4_ = 0x8022;
  uVar4 = stun_attr_type(psVar8);
  local_d8.key_ = (uint8_t *)CONCAT62(local_d8.key_._2_6_,uVar4);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_c8,"type::software","i->type()",(attribute_type *)local_a8,
             (unsigned_short *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xf5,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (((local_a8 != (undefined1  [8])0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_a8 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.key_ = msg_hdr;
  local_d8.key_len_ = (size_t)psVar8;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)local_c8,(string *)&local_d8);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)local_a8,"software_name","i->to<type::software>().to_string()",
             (char (*) [12])&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  plVar2 = (long *)(local_c8 + 0x10);
  if ((long *)local_c8._0_8_ != plVar2) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  if (local_a8[0] == (anon_unknown_dwarf_24028)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (sStack_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xf7,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((((long *)local_c8._0_8_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)
        ) && ((long *)local_c8._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012936b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr = (stun_attr_xor_sockaddr *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,psVar8);
  local_a8[0] = (anon_unknown_dwarf_24028)(attr != (stun_attr_xor_sockaddr *)0x0);
  sStack_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (attr == (stun_attr_xor_sockaddr *)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_a8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xf9,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_c8._0_8_ != plVar2) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if ((((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((stun_msg_hdr *)local_d8.key_ != (stun_msg_hdr *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012936b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_4_ = 0x20;
  uVar4 = stun_attr_type((stun_attr_hdr *)attr);
  local_d8.key_ = (uint8_t *)CONCAT62(local_d8.key_._2_6_,uVar4);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_c8,"type::xor_mapped_address","i->type()",(attribute_type *)local_a8,
             (unsigned_short *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xfa,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (((local_a8 != (undefined1  [8])0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_a8 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = (undefined1  [8])0x0;
  sStack_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  iVar5 = stun_attr_xor_sockaddr_read(attr,(stun_msg_hdr *)msg_hdr,(sockaddr *)local_a8);
  local_d8.key_ = (uint8_t *)CONCAT71(local_d8.key_._1_7_,iVar5 == 0);
  local_d8.key_len_ = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,
               (AssertionResult *)
               "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xfe,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_c8._0_8_ != plVar2) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if (((CONCAT44(local_e0.data_._4_4_,CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)) !=
          0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (plVar1 = (long *)CONCAT44(local_e0.data_._4_4_,
                                  CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)),
       plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.key_len_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.key_ = (uint8_t *)CONCAT44(local_d8.key_._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)local_c8,"2","test_addr.sin_family",(int *)&local_d8,
             (unsigned_short *)local_a8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xff,pcVar10);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((((long *)local_d8.key_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3))
       && ((long *)local_d8.key_ != (long *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.key_ = (uint8_t *)CONCAT62(local_d8.key_._2_6_,0x5580);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)local_c8,"__bswap_16 (32853)","test_addr.sin_port",
             (unsigned_short *)&local_d8,(unsigned_short *)(local_a8 + 2));
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x100,pcVar10);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((((long *)local_d8.key_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3))
       && ((long *)local_d8.key_ != (long *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.key_ = (uint8_t *)((ulong)local_d8.key_ & 0xffffffff00000000);
  uVar6 = (uint)local_a8._4_4_ >> 0x18 | (local_a8._4_4_ & 0xff0000) >> 8 |
          (local_a8._4_4_ & 0xff00) << 8 | local_a8._4_4_ << 0x18;
  uVar9 = local_48._M_dataplus._M_p._4_4_ >> 0x18 |
          (local_48._M_dataplus._M_p._4_4_ & 0xff0000) >> 8 |
          (local_48._M_dataplus._M_p._4_4_ & 0xff00) << 8 | local_48._M_dataplus._M_p._4_4_ << 0x18;
  local_e0.data_._0_4_ = (uint)(uVar6 >= uVar9 && uVar6 != uVar9) - (uint)(uVar6 < uVar9);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"0",
             "memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",(int *)&local_d8,
             (int *)&local_e0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x102,pcVar10);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_d8.key_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_d8.key_ != (long *)0x0)) {
        (**(code **)(*(long *)local_d8.key_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msgint = (stun_attr_msgint *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)attr);
  local_d8.key_ = (uint8_t *)CONCAT71(local_d8.key_._1_7_,msgint != (stun_attr_msgint *)0x0);
  local_d8.key_len_ = 0;
  if (msgint == (stun_attr_msgint *)0x0) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x104,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_c8._0_8_ != plVar2) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if (CONCAT44(local_e0.data_._4_4_,(int)local_e0.data_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)CONCAT44(local_e0.data_._4_4_,(int)local_e0.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int)local_e0.data_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012936b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.key_len_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.key_ = (uint8_t *)CONCAT44(local_d8.key_._4_4_,8);
  uVar4 = stun_attr_type((stun_attr_hdr *)msgint);
  local_e0.data_._0_2_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_c8,"type::message_integrity","i->type()",(attribute_type *)&local_d8,
             (unsigned_short *)&local_e0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x105,pcVar10);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((((long *)local_d8.key_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3))
       && ((long *)local_d8.key_ != (long *)0x0)) {
      (**(code **)(*(long *)local_d8.key_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8._0_8_ = plVar2;
  sVar7 = strlen(local_78.field_2._M_local_buf);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,&local_78.field_2,(long)&local_78.field_2 + sVar7);
  iVar5 = stun_attr_msgint_check
                    (msgint,(stun_msg_hdr *)msg_hdr,(uint8_t *)local_c8._0_8_,local_c8._8_8_);
  local_d8.key_ = (uint8_t *)CONCAT71(local_d8.key_._1_7_,iVar5 != 0);
  local_d8.key_len_ = 0;
  if ((long *)local_c8._0_8_ == plVar2) {
    if (iVar5 == 0) goto LAB_0012900d;
  }
  else {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    if (((ulong)local_d8.key_ & 1) == 0) {
LAB_0012900d:
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_d8,
                 (AssertionResult *)"i->to<type::message_integrity>().check_integrity(password)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x107,(char *)local_c8._0_8_);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)local_c8._0_8_ != plVar2) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if (((CONCAT44(local_e0.data_._4_4_,CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_))
            != 0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (plVar1 = (long *)CONCAT44(local_e0.data_._4_4_,
                                    CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)),
         plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.key_len_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fingerprint = (stun_attr_uint32 *)
                stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)msgint);
  local_d8.key_ = (uint8_t *)CONCAT71(local_d8.key_._1_7_,fingerprint != (stun_attr_uint32 *)0x0);
  local_d8.key_len_ = 0;
  if (fingerprint == (stun_attr_uint32 *)0x0) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x109,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_c8._0_8_ != plVar2) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    if (((CONCAT44(local_e0.data_._4_4_,CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)) !=
          0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (plVar2 = (long *)CONCAT44(local_e0.data_._4_4_,
                                  CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)),
       plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_d8.key_ = (uint8_t *)CONCAT44(local_d8.key_._4_4_,0x8028);
    local_e0.data_._0_2_ = stun_attr_type((stun_attr_hdr *)fingerprint);
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)local_c8,"type::fingerprint","i->type()",(attribute_type *)&local_d8,
               (unsigned_short *)&local_e0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((_Alloc_hider *)local_c8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x10a,pcVar10);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if ((((long *)local_d8.key_ != (long *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((long *)local_d8.key_ != (long *)0x0)) {
        (**(code **)(*(long *)local_d8.key_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    iVar5 = stun_attr_fingerprint_check(fingerprint,(stun_msg_hdr *)msg_hdr);
    bVar3 = iVar5 != 0;
    local_d8.key_len_ = 0;
    local_d8.key_._0_1_ = bVar3;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_d8,
                 (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x10c,(char *)local_c8._0_8_);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)local_c8._0_8_ != plVar2) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if (((CONCAT44(local_e0.data_._4_4_,CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_))
            != 0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (plVar1 = (long *)CONCAT44(local_e0.data_._4_4_,
                                    CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)),
         plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    psVar8 = stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)fingerprint);
    local_d8.key_ = (uint8_t *)CONCAT71(local_d8.key_._1_7_,psVar8 == (stun_attr_hdr *)0x0);
    local_d8.key_len_ = 0;
    if (psVar8 != (stun_attr_hdr *)0x0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_d8,(AssertionResult *)"message.end() == ++i",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x10e,(char *)local_c8._0_8_);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)local_c8._0_8_ != plVar2) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if (((CONCAT44(local_e0.data_._4_4_,CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_))
            != 0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (plVar2 = (long *)CONCAT44(local_e0.data_._4_4_,
                                    CONCAT22(local_e0.data_._2_2_,(uint16_t)local_e0.data_)),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
LAB_0012936b:
  if ((stun_msg_hdr *)
      local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_90.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv4)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}